

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1031:7),_kj::_::PropagateException>_>
::dispose(Own<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>_>
          *this)

{
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>
  *object;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>
  *ptrCopy;
  Own<kj::_::TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>_>
  *this_local;
  
  object = this->ptr;
  if (object != (TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>
                 *)0x0) {
    this->ptr = (TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_test_util_c__:1031:7),_kj::_::PropagateException>
                 *)0x0;
    Disposer::
    dispose<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestMoreStuffImpl::callFoo(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>)::__0,kj::_::PropagateException>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }